

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O1

void MultiplicativeExpression_div_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  JsValue *res_01;
  JsValue *pJVar1;
  undefined1 local_c0 [8];
  JsValue r5;
  JsValue r6;
  JsValue r1;
  JsValue r2;
  JsValue r3;
  JsValue r4;
  
  pJVar1 = (JsValue *)((long)&r6.u + 8);
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])(*(JsAstNode **)(na + 1),context,pJVar1);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue(pJVar1,res_00);
  pJVar1 = (JsValue *)((long)&r2.u + 8);
  (*JsNodeClassEval[((JsAstNode *)na[1].location)->astClass])
            ((JsAstNode *)na[1].location,context,pJVar1);
  res_01 = (JsValue *)((long)&r3.u + 8);
  JsGetValue(pJVar1,res_01);
  JsToNumber(res_00,(JsValue *)local_c0);
  JsToNumber(res_01,(JsValue *)((long)&r5.u + 8));
  res->type = JS_NUMBER;
  (res->u).number = (double)r5._0_8_ / (double)r6._0_8_;
  return;
}

Assistant:

static void
MultiplicativeExpression_div_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstBinaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstBinaryNode *n = CAST_NODE(na, JsAstBinaryNode);
	struct JsValue r1, r2, r3, r4;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	EVAL(n->b, context, &r3);
	JsGetValue( &r3, &r4);
    MultiplicativeExpression_div_common(&r2, &r4, context, res);
}